

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O2

bool __thiscall MetaCommand::ParseXML(MetaCommand *this,char *buffer)

{
  int iVar1;
  int iVar2;
  unsigned_long uVar3;
  MetaCommand *pMVar4;
  char *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined8 this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_02;
  bool bVar6;
  string buf;
  string f;
  string local_1d8;
  string local_1b8;
  char *local_198;
  OptionVector *local_190;
  unsigned_long local_188;
  undefined1 local_180 [32];
  _Alloc_hider local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  _Alloc_hider local_140;
  size_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  TypeEnumType local_120;
  int local_11c;
  char *local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  char *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined1 local_d8;
  undefined1 local_d7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0 [2];
  undefined1 local_b0 [32];
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_190 = &this->m_OptionVector;
  pMVar4 = (MetaCommand *)buffer;
  std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::clear(local_190);
  local_198 = buffer;
  GetXML_abi_cxx11_(&local_1d8,pMVar4,buffer,"option",0);
  uVar3 = 0;
  while (local_1d8._M_string_length != 0) {
    local_b0._0_8_ = local_b0 + 0x10;
    local_b0._8_8_ = (pointer)0x0;
    local_b0[0x10] = '\0';
    local_90._M_p = (pointer)&local_80;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_70._M_allocated_capacity = (size_type)&local_60;
    local_70._8_8_ = 0;
    local_60._M_local_buf[0] = '\0';
    local_50._M_allocated_capacity = 0;
    local_50._8_8_ = 0;
    local_40._M_allocated_capacity = 0;
    GetXML_abi_cxx11_((string *)local_180,pMVar4,local_1d8._M_dataplus._M_p,"name",0);
    pMVar4 = (MetaCommand *)local_180;
    std::__cxx11::string::operator=((string *)local_b0,(string *)local_180);
    std::__cxx11::string::~string((string *)local_180);
    GetXML_abi_cxx11_((string *)local_180,pMVar4,local_1d8._M_dataplus._M_p,"tag",0);
    pMVar4 = (MetaCommand *)local_180;
    std::__cxx11::string::operator=((string *)local_70._M_local_buf,(string *)local_180);
    std::__cxx11::string::~string((string *)local_180);
    GetXML_abi_cxx11_((string *)local_180,pMVar4,local_1d8._M_dataplus._M_p,"description",0);
    pMVar4 = (MetaCommand *)local_180;
    local_188 = uVar3;
    std::__cxx11::string::operator=((string *)(local_b0 + 0x20),(string *)local_180);
    std::__cxx11::string::~string((string *)local_180);
    GetXML_abi_cxx11_((string *)local_180,pMVar4,local_1d8._M_dataplus._M_p,"required",0);
    iVar1 = atoi((char *)local_180._0_8_);
    std::__cxx11::string::~string((string *)local_180);
    local_40._M_local_buf[8] = iVar1 != 0;
    GetXML_abi_cxx11_((string *)local_180,pMVar4,local_1d8._M_dataplus._M_p,"nvalues",0);
    iVar1 = atoi((char *)local_180._0_8_);
    std::__cxx11::string::~string((string *)local_180);
    this_00 = "<field>";
    uVar3 = std::__cxx11::string::find((char *)&local_1d8,0x15488f);
    while (bVar6 = iVar1 != 0, iVar1 = iVar1 + -1, bVar6) {
      GetXML_abi_cxx11_(&local_1b8,(MetaCommand *)this_00,local_1d8._M_dataplus._M_p,"field",uVar3);
      local_180._0_8_ = local_180 + 0x10;
      local_180._8_8_ = 0;
      local_180[0x10] = '\0';
      local_160._M_p = (pointer)&local_150;
      local_158 = 0;
      local_150._M_local_buf[0] = '\0';
      local_140._M_p = (pointer)&local_130;
      local_138 = 0;
      local_130._M_local_buf[0] = '\0';
      local_118 = local_110._M_local_buf + 8;
      local_110._M_allocated_capacity = 0;
      local_110._M_local_buf[8] = '\0';
      local_f8 = local_f0._M_local_buf + 8;
      local_f0._M_allocated_capacity = 0;
      local_f0._M_local_buf[8] = '\0';
      local_d7 = 0;
      GetXML_abi_cxx11_((string *)local_d0,(MetaCommand *)this_00,local_1b8._M_dataplus._M_p,"name",
                        0);
      paVar5 = local_d0;
      std::__cxx11::string::operator=((string *)local_180,(string *)local_d0[0]._M_local_buf);
      std::__cxx11::string::~string((string *)local_d0[0]._M_local_buf);
      GetXML_abi_cxx11_((string *)local_d0,(MetaCommand *)paVar5,local_1b8._M_dataplus._M_p,
                        "description",0);
      paVar5 = local_d0;
      std::__cxx11::string::operator=((string *)&local_160,(string *)local_d0[0]._M_local_buf);
      std::__cxx11::string::~string((string *)local_d0[0]._M_local_buf);
      GetXML_abi_cxx11_((string *)local_d0,(MetaCommand *)paVar5,local_1b8._M_dataplus._M_p,"value",
                        0);
      paVar5 = local_d0;
      std::__cxx11::string::operator=((string *)&local_140,(string *)local_d0[0]._M_local_buf);
      std::__cxx11::string::~string((string *)local_d0[0]._M_local_buf);
      this_02 = local_d0;
      GetXML_abi_cxx11_((string *)local_d0,(MetaCommand *)paVar5,local_1b8._M_dataplus._M_p,"type",0
                       );
      this_01 = local_d0[0]._M_allocated_capacity;
      local_120 = StringToType((MetaCommand *)this_02,(char *)local_d0[0]._0_8_);
      std::__cxx11::string::~string((string *)local_d0[0]._M_local_buf);
      GetXML_abi_cxx11_((string *)local_d0,(MetaCommand *)this_01,local_1b8._M_dataplus._M_p,
                        "external",0);
      iVar2 = atoi((char *)local_d0[0]._0_8_);
      std::__cxx11::string::~string((string *)local_d0[0]._M_local_buf);
      if (iVar2 == 0) {
        local_11c = 0;
      }
      else {
        GetXML_abi_cxx11_((string *)local_d0,(MetaCommand *)this_01,local_1b8._M_dataplus._M_p,
                          "external",0);
        iVar2 = atoi((char *)local_d0[0]._0_8_);
        std::__cxx11::string::~string((string *)local_d0[0]._M_local_buf);
        local_11c = (iVar2 != 1) + 1;
      }
      GetXML_abi_cxx11_((string *)local_d0,(MetaCommand *)this_01,local_1b8._M_dataplus._M_p,
                        "required",0);
      iVar2 = atoi((char *)local_d0[0]._0_8_);
      std::__cxx11::string::~string((string *)local_d0[0]._M_local_buf);
      local_d8 = iVar2 != 0;
      this_00 = (char *)local_180;
      std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::push_back
                ((vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_> *)&local_50,
                 (value_type *)local_180);
      uVar3 = uVar3 + local_1b8._M_string_length + 8;
      Field::~Field((Field *)local_180);
      std::__cxx11::string::~string((string *)&local_1b8);
    }
    pMVar4 = (MetaCommand *)local_b0;
    std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::push_back
              (local_190,(value_type *)local_b0);
    uVar3 = local_188 + local_1d8._M_string_length + 0x11;
    GetXML_abi_cxx11_((string *)local_180,pMVar4,local_198,"option",uVar3);
    pMVar4 = (MetaCommand *)local_180;
    std::__cxx11::string::operator=((string *)&local_1d8,(string *)local_180);
    std::__cxx11::string::~string((string *)local_180);
    Option::~Option((Option *)local_b0);
  }
  std::__cxx11::string::~string((string *)&local_1d8);
  return true;
}

Assistant:

bool MetaCommand::ParseXML(const char* buffer)
{
  m_OptionVector.clear();
  METAIO_STL::string buf = this->GetXML(buffer,"option",0);
  long pos = 0;
  while (!buf.empty()) {
    Option option;
    option.name = this->GetXML(buf.c_str(),"name",0);
    option.tag = this->GetXML(buf.c_str(),"tag",0);
    option.description = this->GetXML(buf.c_str(),"description",0);
    if(atoi(this->GetXML(buf.c_str(),"required",0).c_str()) == 0)
      {
      option.required = false;
      }
    else
      {
      option.required = true;
      }
    unsigned int n = atoi(this->GetXML(buf.c_str(),"nvalues",0).c_str());

    // Now check the fields
    long posF = static_cast<long>(buf.find("<field>"));
    for(unsigned int i=0;i<n;i++)
      {
      METAIO_STL::string f = this->GetXML(buf.c_str(),"field",posF);
      Field field;
      field.userDefined = false;
      field.name = this->GetXML(f.c_str(),"name",0);
      field.description = this->GetXML(f.c_str(),"description",0);
      field.value = this->GetXML(f.c_str(),"value",0);
      field.type = this->StringToType(this->GetXML(f.c_str(),"type",0).c_str());
      if(atoi(this->GetXML(f.c_str(),"external",0).c_str()) == 0)
        {
        field.externaldata = DATA_NONE;
        }
      else
        {
        if(atoi(this->GetXML(f.c_str(),"external",0).c_str()) == 1)
          {
          field.externaldata = DATA_IN;
          }
        else
          {
          field.externaldata = DATA_OUT;
          }
        }
      if(atoi(this->GetXML(f.c_str(),"required",0).c_str()) == 0)
        {
        field.required = false;
        }
      else
        {
        field.required = true;
        }

      option.fields.push_back(field);
      posF += static_cast<long>(f.size())+8;
      }

    m_OptionVector.push_back(option);

    pos += static_cast<long>(buf.size())+17;
    buf = this->GetXML(buffer,"option",pos);
  }

  return true;
}